

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea_io.c
# Opt level: O0

int CVodeSetMaxStepB(void *cvode_mem,int which,sunrealtype hmaxB)

{
  int in_ESI;
  CVodeMem in_RDI;
  int flag;
  void *cvodeB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeBMemRec *cvode_mem_00;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x1a4,"CVodeSetMaxStepB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_adjMallocDone == 0) {
    cvProcessError(in_RDI,-0x65,0x1ac,"CVodeSetMaxStepB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea_io.c"
                   ,"Illegal attempt to call before calling CVodeAdjMalloc.");
    local_4 = -0x65;
  }
  else if (in_ESI < in_RDI->cv_adj_mem->ca_nbckpbs) {
    for (cvode_mem_00 = in_RDI->cv_adj_mem->cvB_mem;
        (cvode_mem_00 != (CVodeBMemRec *)0x0 && (in_ESI != cvode_mem_00->cv_index));
        cvode_mem_00 = cvode_mem_00->cv_next) {
    }
    local_4 = CVodeSetMaxStep(cvode_mem_00,(sunrealtype)cvode_mem_00->cv_mem);
  }
  else {
    cvProcessError(in_RDI,-0x16,0x1b4,"CVodeSetMaxStepB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea_io.c"
                   ,"Illegal value for which.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSetMaxStepB(void* cvode_mem, int which, sunrealtype hmaxB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  int flag;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_WHICH);
    return (CV_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    cvB_mem = cvB_mem->cv_next;
  }

  cvodeB_mem = (void*)(cvB_mem->cv_mem);

  flag = CVodeSetMaxStep(cvodeB_mem, hmaxB);

  return (flag);
}